

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_>::read_next
          (basic_json_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  size_t in_RDI;
  basic_json_parser<char,_std::allocator<char>_> *this_00;
  error_code ec;
  error_code *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffc8;
  ser_error *in_stack_ffffffffffffffd0;
  error_code *in_stack_ffffffffffffffe8;
  basic_json_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_>
  *in_stack_fffffffffffffff0;
  
  std::error_code::error_code(in_stack_ffffffffffffffa0);
  read_next(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe8);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  this_00 = (basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x30);
  basic_json_parser<char,_std::allocator<char>_>::line(this_00);
  basic_json_parser<char,_std::allocator<char>_>::column(this_00);
  ec_00._M_cat = (error_category *)in_stack_fffffffffffffff0;
  ec_00._0_8_ = in_stack_ffffffffffffffe8;
  ser_error::ser_error(in_stack_ffffffffffffffd0,ec_00,in_stack_ffffffffffffffc8,in_RDI);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void read_next()
        {
            std::error_code ec;
            read_next(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec,parser_.line(),parser_.column()));
            }
        }